

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int arena_i_decay_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  int iVar1;
  
  iVar1 = 1;
  if ((newp == (void *)0x0 && newlen == 0) && (oldp == (void *)0x0 && oldlenp == (size_t *)0x0)) {
    iVar1 = 0xe;
    if (mib[1] >> 0x20 == 0) {
      iVar1 = 0;
      arena_i_decay((tsdn_t *)tsd,(uint)mib[1],false);
    }
  }
  return iVar1;
}

Assistant:

static int
arena_i_decay_ctl(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned arena_ind;

	READONLY();
	WRITEONLY();
	MIB_UNSIGNED(arena_ind, 1);
	arena_i_decay(tsd_tsdn(tsd), arena_ind, false);

	ret = 0;
label_return:
	return ret;
}